

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::V5::ControlPacketSerializableImpl::readFrom
          (ControlPacketSerializableImpl *this,uint8 *buffer,uint32 bufLength)

{
  ushort uVar1;
  SerializablePayload *pSVar2;
  ushort uVar3;
  uint32 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint8 *puVar10;
  
  uVar4 = 0xfffffffe;
  if (1 < bufLength) {
    this->header->typeAndFlags = *buffer;
    (this->remLength).size = 0;
    uVar3 = 0;
    do {
      if (bufLength - 1 <= (uint)uVar3) {
        return 0xfffffffe;
      }
      (this->remLength).field_0.value[uVar3] = buffer[(ulong)uVar3 + 1];
      uVar1 = (this->remLength).size;
      uVar3 = uVar1 + 1;
      (this->remLength).size = uVar3;
      if (-1 < (char)(this->remLength).field_0.value[uVar1]) {
        uVar9 = (uint)uVar3;
        uVar8 = (bufLength - 1) - uVar9;
        uVar4 = Common::VBInt::operator_cast_to_unsigned_int(&this->remLength);
        if (uVar8 < uVar4) {
          return 0xfffffffe;
        }
        puVar10 = buffer + (ulong)uVar9 + 1;
        (*(this->fixedVariableHeader->super_Serializable)._vptr_Serializable[4])
                  (this->fixedVariableHeader,(ulong)uVar4);
        uVar5 = (*(this->fixedVariableHeader->super_Serializable)._vptr_Serializable[2])
                          (this->fixedVariableHeader,puVar10,(ulong)uVar8);
        if (0xfffffffc < uVar5) {
          if (uVar5 == 0xfffffffd) {
            return uVar4 + uVar9 + 1;
          }
          return uVar5;
        }
        uVar6 = (*(this->props->super_Serializable)._vptr_Serializable[2])
                          (this->props,puVar10 + uVar5,(ulong)(uVar8 - uVar5));
        if (0xfffffffc < uVar6) {
          return uVar6;
        }
        pSVar2 = this->payload;
        uVar7 = (*(this->super_ControlPacketSerializable).super_Serializable._vptr_Serializable[3])
                          (this,0);
        (*(pSVar2->super_EmptySerializable).super_Serializable._vptr_Serializable[4])
                  (pSVar2,(ulong)uVar7);
        uVar8 = (*(this->payload->super_EmptySerializable).super_Serializable._vptr_Serializable[2])
                          (this->payload,puVar10 + uVar5 + uVar6,(ulong)((uVar8 - uVar5) - uVar6));
        if (0xfffffffc < uVar8) {
          return uVar8;
        }
        return uVar5 + uVar9 + 1 + uVar6 + uVar8;
      }
    } while (uVar3 != 4);
    uVar4 = 0xffffffff;
  }
  return uVar4;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    if (bufLength < 2) return NotEnoughData;
                    uint32 o = 1; const_cast<uint8&>(header.typeAndFlags) = buffer[0];

                    buffer += o; bufLength -= o;

                    uint32 s = remLength.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    o += s; buffer += s; bufLength -= s;
                    uint32 expLength = (uint32)remLength;
                    if (bufLength < expLength) return NotEnoughData;

                    fixedVariableHeader.setRemainingLength(expLength);
                    s = fixedVariableHeader.readFrom(buffer, bufLength);
                    if (isError(s)) return isShortcut(s) ? o + expLength : s;
                    o += s; buffer += s; bufLength -= s;

                    s = props.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    o += s; buffer += s; bufLength -= s;

                    payload.setExpectedPacketSize(computePacketSize(false));
                    s = payload.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    return o + s;
                }